

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeInitialNodeOrientation(ChElementShellReissner4 *this)

{
  undefined8 *puVar1;
  pointer psVar2;
  long lVar3;
  ChVector<double> *pCVar4;
  long lVar5;
  ChMatrix33<double> *pCVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  ChVector<double> t2;
  ChVector<double> t1;
  ChMatrix33<double> t123;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  long local_88;
  double *local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = this->xa;
  lVar5 = 0;
  do {
    lVar3 = *(long *)((long)&(psVar2->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar5);
    if (pCVar4 != (ChVector<double> *)(lVar3 + 0x20)) {
      pCVar4->m_data[0] = *(double *)(lVar3 + 0x20);
      pCVar4->m_data[1] = *(double *)(lVar3 + 0x28);
      pCVar4->m_data[2] = *(double *)(lVar3 + 0x30);
    }
    pCVar4 = pCVar4 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  pCVar4 = this->xa;
  pCVar6 = this->iTa;
  lVar5 = 0;
  do {
    InterpDeriv_xi1(pCVar4,(double *)(xi_n + lVar5));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_a0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_98 * local_98;
    auVar8 = vfmadd231sd_fma(auVar8,auVar29,auVar29);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_90;
    auVar8 = vfmadd231sd_fma(auVar8,auVar50,auVar50);
    if (auVar8._0_8_ < 0.0) {
      dVar7 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar7 = auVar8._0_8_;
    }
    dVar7 = 1.0 / dVar7;
    local_a0 = local_a0 * dVar7;
    local_98 = local_98 * dVar7;
    local_90 = local_90 * dVar7;
    InterpDeriv_xi2(pCVar4,(double *)(xi_n + lVar5));
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_b8;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_b0 * local_b0;
    auVar8 = vfmadd231sd_fma(auVar9,auVar30,auVar30);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_a8;
    auVar8 = vfmadd231sd_fma(auVar8,auVar51,auVar51);
    if (auVar8._0_8_ < 0.0) {
      dVar7 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar7 = auVar8._0_8_;
    }
    dVar7 = 1.0 / dVar7;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_90;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_98;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_a8 * dVar7;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_b0 * dVar7 * local_90;
    auVar29 = vfmsub231sd_fma(auVar68,auVar52,auVar10);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_a0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_b8 * dVar7;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_a8 * dVar7 * local_a0;
    auVar8 = vfmsub231sd_fma(auVar74,auVar41,auVar23);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_b0 * dVar7;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_b8 * dVar7 * local_98;
    auVar50 = vfmsub231sd_fma(auVar42,auVar62,auVar31);
    dVar7 = auVar8._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar7 * dVar7;
    auVar8 = vfmadd231sd_fma(auVar11,auVar29,auVar29);
    auVar8 = vfmadd231sd_fma(auVar8,auVar50,auVar50);
    if (auVar8._0_8_ < 0.0) {
      local_38 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      local_38 = auVar8._0_8_;
    }
    local_38 = 1.0 / local_38;
    local_68 = auVar29._0_8_ * local_38;
    local_50 = dVar7 * local_38;
    local_38 = auVar50._0_8_ * local_38;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_98;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_90;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_50;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_98 * local_38;
    auVar8 = vfmsub231sd_fma(auVar43,auVar32,auVar69);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = local_a0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_38;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_90 * local_68;
    auVar29 = vfmsub231sd_fma(auVar53,auVar12,auVar80);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_68;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_a0 * local_50;
    auVar50 = vfmsub231sd_fma(auVar63,auVar24,auVar75);
    local_b8 = auVar8._0_8_;
    local_b0 = auVar29._0_8_;
    local_a8 = auVar50._0_8_;
    local_88 = *(long *)((long)&(((this->m_nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar5) + 0x58;
    local_80 = &local_78;
    local_78 = local_a0;
    local_70 = local_b8;
    local_60 = local_98;
    local_58 = local_b0;
    local_48 = local_90;
    local_40 = local_a8;
    ChMatrix33<double>::operator=
              (pCVar6,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                       *)&local_88);
    pCVar6 = pCVar6 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  lVar5 = 0x26e8;
  do {
    *(undefined8 *)((long)this + lVar5 + -0x40) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)this + lVar5 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this + lVar5 + -0x28) = 0;
    *(undefined8 *)((long)this + lVar5 + -0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)this + lVar5 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this + lVar5 + -8) = 0;
    *(undefined8 *)
     ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase + lVar5) = 0x3ff0000000000000;
    lVar5 = lVar5 + 0x48;
  } while (lVar5 != 0x2808);
  lVar5 = 0x2808;
  do {
    *(undefined8 *)((long)this + lVar5 + -0x40) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)this + lVar5 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this + lVar5 + -0x28) = 0;
    *(undefined8 *)((long)this + lVar5 + -0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)this + lVar5 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)this + lVar5 + -8) = 0;
    *(undefined8 *)
     ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase + lVar5) = 0x3ff0000000000000;
    lVar5 = lVar5 + 0x48;
  } while (lVar5 != 0x2928);
  UpdateNodalAndAveragePosAndOrientation(this);
  InterpolateOrientation(this);
  pCVar6 = this->iTa_i;
  lVar5 = 0;
  do {
    InterpDeriv_xi1(pCVar4,(double *)((long)&xi_i + lVar5));
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_a0;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_98 * local_98;
    auVar8 = vfmadd231sd_fma(auVar13,auVar33,auVar33);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_90;
    auVar8 = vfmadd231sd_fma(auVar8,auVar54,auVar54);
    if (auVar8._0_8_ < 0.0) {
      dVar7 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar7 = auVar8._0_8_;
    }
    dVar7 = 1.0 / dVar7;
    local_a0 = local_a0 * dVar7;
    local_98 = local_98 * dVar7;
    local_90 = local_90 * dVar7;
    InterpDeriv_xi2(pCVar4,(double *)((long)&xi_i + lVar5));
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_b8;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_b0 * local_b0;
    auVar8 = vfmadd231sd_fma(auVar14,auVar34,auVar34);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_a8;
    auVar8 = vfmadd231sd_fma(auVar8,auVar55,auVar55);
    if (auVar8._0_8_ < 0.0) {
      dVar7 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar7 = auVar8._0_8_;
    }
    dVar7 = 1.0 / dVar7;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_90;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_98;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_a8 * dVar7;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_b0 * dVar7 * local_90;
    auVar29 = vfmsub231sd_fma(auVar70,auVar56,auVar15);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_a0;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_b8 * dVar7;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_a8 * dVar7 * local_a0;
    auVar8 = vfmsub231sd_fma(auVar76,auVar44,auVar25);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_b0 * dVar7;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_b8 * dVar7 * local_98;
    auVar50 = vfmsub231sd_fma(auVar45,auVar64,auVar35);
    dVar7 = auVar8._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar7 * dVar7;
    auVar8 = vfmadd231sd_fma(auVar16,auVar29,auVar29);
    auVar8 = vfmadd231sd_fma(auVar8,auVar50,auVar50);
    if (auVar8._0_8_ < 0.0) {
      local_38 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      local_38 = auVar8._0_8_;
    }
    local_38 = 1.0 / local_38;
    local_68 = auVar29._0_8_ * local_38;
    local_50 = dVar7 * local_38;
    local_38 = auVar50._0_8_ * local_38;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_98;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_90;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_50;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_98 * local_38;
    auVar8 = vfmsub231sd_fma(auVar46,auVar36,auVar71);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = local_a0;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_38;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_90 * local_68;
    auVar29 = vfmsub231sd_fma(auVar57,auVar17,auVar81);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_68;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_a0 * local_50;
    auVar50 = vfmsub231sd_fma(auVar65,auVar26,auVar77);
    local_b8 = auVar8._0_8_;
    local_b0 = auVar29._0_8_;
    local_a8 = auVar50._0_8_;
    local_88 = (long)(pCVar6 + 0x18) + 0x18;
    local_80 = &local_78;
    local_78 = local_a0;
    local_70 = local_b8;
    local_60 = local_98;
    local_58 = local_b0;
    local_48 = local_90;
    local_40 = local_a8;
    ChMatrix33<double>::operator=
              (pCVar6,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                       *)&local_88);
    pCVar6 = pCVar6 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  pCVar6 = this->iTa_A;
  lVar5 = 0;
  do {
    InterpDeriv_xi1(pCVar4,(double *)(xi_A + lVar5));
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_a0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_98 * local_98;
    auVar8 = vfmadd231sd_fma(auVar18,auVar37,auVar37);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_90;
    auVar8 = vfmadd231sd_fma(auVar8,auVar58,auVar58);
    if (auVar8._0_8_ < 0.0) {
      dVar7 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar7 = auVar8._0_8_;
    }
    dVar7 = 1.0 / dVar7;
    local_a0 = local_a0 * dVar7;
    local_98 = local_98 * dVar7;
    local_90 = local_90 * dVar7;
    InterpDeriv_xi2(pCVar4,(double *)(xi_A + lVar5));
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_b8;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_b0 * local_b0;
    auVar8 = vfmadd231sd_fma(auVar19,auVar38,auVar38);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_a8;
    auVar8 = vfmadd231sd_fma(auVar8,auVar59,auVar59);
    if (auVar8._0_8_ < 0.0) {
      dVar7 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar7 = auVar8._0_8_;
    }
    dVar7 = 1.0 / dVar7;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_90;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_98;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_a8 * dVar7;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_b0 * dVar7 * local_90;
    auVar29 = vfmsub231sd_fma(auVar72,auVar60,auVar20);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_a0;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_b8 * dVar7;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = local_a8 * dVar7 * local_a0;
    auVar8 = vfmsub231sd_fma(auVar78,auVar47,auVar27);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_b0 * dVar7;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_b8 * dVar7 * local_98;
    auVar50 = vfmsub231sd_fma(auVar48,auVar66,auVar39);
    dVar7 = auVar8._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar7 * dVar7;
    auVar8 = vfmadd231sd_fma(auVar21,auVar29,auVar29);
    auVar8 = vfmadd231sd_fma(auVar8,auVar50,auVar50);
    if (auVar8._0_8_ < 0.0) {
      local_38 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      local_38 = auVar8._0_8_;
    }
    local_38 = 1.0 / local_38;
    local_68 = auVar29._0_8_ * local_38;
    local_50 = dVar7 * local_38;
    local_38 = auVar50._0_8_ * local_38;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_98;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_90;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_50;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_98 * local_38;
    auVar8 = vfmsub231sd_fma(auVar49,auVar40,auVar73);
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_a0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_38;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_90 * local_68;
    auVar29 = vfmsub231sd_fma(auVar61,auVar22,auVar82);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_68;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_a0 * local_50;
    auVar50 = vfmsub231sd_fma(auVar67,auVar28,auVar79);
    local_b8 = auVar8._0_8_;
    local_b0 = auVar29._0_8_;
    local_a8 = auVar50._0_8_;
    local_88 = (long)(pCVar6 + 0x18) + 0x18;
    local_80 = &local_78;
    local_78 = local_a0;
    local_70 = local_b8;
    local_60 = local_98;
    local_58 = local_b0;
    local_48 = local_90;
    local_40 = local_a8;
    ChMatrix33<double>::operator=
              (pCVar6,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                       *)&local_88);
    pCVar6 = pCVar6 + 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  InterpolateOrientation(this);
  return;
}

Assistant:

void ChElementShellReissner4::ComputeInitialNodeOrientation() {
    for (int i = 0; i < NUMNODES; i++) {
        xa[i] = this->m_nodes[i]->GetPos();
    }
    for (int i = 0; i < NUMNODES; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_n[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_n[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa[i] = m_nodes[i]->GetA().transpose() * t123;
    }
    for (int i = 0; i < NUMIP; i++) {
        iTa_i[i] = ChMatrix33<>(1);
    }
    for (int i = 0; i < NUMSSEP; i++) {
        iTa_A[i] = ChMatrix33<>(1);
    }
    UpdateNodalAndAveragePosAndOrientation();
    InterpolateOrientation();
    for (int i = 0; i < NUMIP; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_i[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_i[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa_i[i] = T_i[i].transpose() * t123;
    }
    for (int i = 0; i < NUMSSEP; i++) {
        ChVector<> t1 = InterpDeriv_xi1(xa, xi_A[i]);
        t1 = t1 / t1.Length();
        ChVector<> t2 = InterpDeriv_xi2(xa, xi_A[i]);
        t2 = t2 / t2.Length();
        ChVector<> t3 = Vcross(t1, t2);
        t3 = t3 / t3.Length();
        t2 = Vcross(t3, t1);
        ChMatrix33<> t123(t1, t2, t3);
        iTa_A[i] = T_A[i].transpose() * t123;
    }
    InterpolateOrientation();
}